

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

int __thiscall MatchTable::match(MatchTable *this,char *txt)

{
  char cVar1;
  int *piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  pointer piVar4;
  pointer piVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  int j;
  long lVar9;
  int i_1;
  ulong uVar10;
  allocator_type local_4d;
  int state;
  vector<int,_std::allocator<int>_> curr_vec;
  
  state = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&curr_vec,*(long *)(this + 8) - *(long *)this >> 3,&state,&local_4d);
  for (lVar7 = 0; cVar1 = txt[lVar7], (long)cVar1 != 0; lVar7 = lVar7 + 1) {
    plVar8 = *(long **)(this + 0x18);
    for (lVar9 = 0;
        (long)curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2 != lVar9; lVar9 = lVar9 + 1) {
      curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] =
           *(int *)(*(long *)(*plVar8 +
                             (long)curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar9] * 0x18) + (long)cVar1 * 4
                   );
      plVar8 = plVar8 + 6;
    }
  }
  lVar7 = 8;
  uVar10 = 0;
  iVar6 = -1;
  piVar4 = curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  do {
    if ((ulong)((long)piVar5 - (long)piVar4 >> 2) <= uVar10) {
LAB_001050b8:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&curr_vec.super__Vector_base<int,_std::allocator<int>_>);
      return iVar6;
    }
    state = piVar4[uVar10];
    if ((state != 0) &&
       (piVar2 = *(int **)(*(long *)(this + 0x18) + lVar7 * 4),
       _Var3 = std::
               __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (*(undefined8 *)(*(long *)(this + 0x18) + -8 + lVar7 * 4),piVar2,&state),
       piVar4 = curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
       piVar5 = curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish, _Var3._M_current != piVar2)) {
      iVar6 = (int)uVar10;
      goto LAB_001050b8;
    }
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + 0xc;
  } while( true );
}

Assistant:

int MatchTable::match(const char *txt) const {
    std::vector<int> curr_vec(regs.size(), 1);
    for (int i = 0; txt[i] != '\0'; i++) {
        int ch = (int)txt[i];
        for (int j = 0; j < curr_vec.size(); j++) {
            curr_vec[j] = tools[j].dtran[curr_vec[j]][ch];
        }
    }
    for (int i = 0; i < curr_vec.size(); i++) {
        int state = curr_vec[i];
        if (state == 0) continue;
        std::vector<int>::const_iterator first = tools[i].targets.cbegin(),
                f,
                last = tools[i].targets.cend();
        if ((f = std::find(first, last, state)) != last) {
            return i;
        }
    }
    return -1;
}